

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall
EqualArea_RemapEdges_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,Point2f a,Point2f b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *message;
  Point2f p;
  undefined8 in_XMM0_Qb;
  undefined1 extraout_var [56];
  undefined1 auVar3 [64];
  float fVar5;
  undefined8 in_XMM1_Qb;
  undefined1 auVar6 [16];
  Vector3f VVar7;
  Vector3f VVar8;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  float local_3c;
  AssertionResult gtest_ar;
  undefined1 auVar4 [56];
  
  fVar5 = b.super_Tuple2<pbrt::Point2,_float>.y;
  VVar7 = pbrt::EqualAreaSquareToSphere(a);
  local_3c = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
  p = pbrt::WrapEqualAreaSquare(b);
  auVar4 = extraout_var;
  VVar8 = pbrt::EqualAreaSquareToSphere(p);
  auVar3._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fefae147ae147ae
  ;
  auVar6._0_4_ = VVar7.super_Tuple3<pbrt::Vector3,_float>.x *
                 VVar8.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar6._4_4_ = VVar7.super_Tuple3<pbrt::Vector3,_float>.y *
                 VVar8.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar6._8_4_ = (float)in_XMM0_Qb * auVar4._0_4_;
  auVar6._12_4_ = (float)((ulong)in_XMM0_Qb >> 0x20) * auVar4._4_4_;
  auVar6 = vmovshdup_avx(auVar6);
  auVar6 = vfmadd231ss_fma(auVar6,auVar2,auVar3._0_16_);
  auVar1._4_4_ = fVar5;
  auVar1._0_4_ = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar6 = vfmadd231ss_fma(auVar6,auVar1,ZEXT416((uint)local_3c));
  local_50.data_._0_4_ = auVar6._0_4_;
  testing::internal::CmpHelperGT<float,double>
            ((internal *)&gtest_ar,"Dot(av, bv)",".99",(float *)&local_50,(double *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x132,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(EqualArea, RemapEdges) {
    auto checkClose = [&](Point2f a, Point2f b) {
        Vector3f av = EqualAreaSquareToSphere(a);
        b = WrapEqualAreaSquare(b);
        Vector3f bv = EqualAreaSquareToSphere(b);
        EXPECT_GT(Dot(av, bv), .99);
    };

    checkClose(Point2f(.25, .01), Point2f(.25, -.01));
    checkClose(Point2f(.89, .01), Point2f(.89, -.01));

    checkClose(Point2f(.25, .99), Point2f(.25, 1.01));
    checkClose(Point2f(.89, .99), Point2f(.89, 1.01));

    checkClose(Point2f(.01, .66), Point2f(-.01, .66));
    checkClose(Point2f(.01, .15), Point2f(-.01, .15));

    checkClose(Point2f(.99, .66), Point2f(1.01, .66));
    checkClose(Point2f(.99, .15), Point2f(1.01, .15));

    checkClose(Point2f(.01, .01), Point2f(-.01, -.01));
    checkClose(Point2f(.99, .01), Point2f(1.01, -.01));
    checkClose(Point2f(.01, .99), Point2f(-.01, 1.01));
    checkClose(Point2f(.99, .99), Point2f(1.01, 1.01));
}